

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute<double>
          (XmlWriter *this,string *name,double *attribute)

{
  stringstream rss;
  string local_1c0;
  stringstream local_1a0 [392];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::_M_insert<double>(*attribute);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
        std::stringstream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }